

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O1

void __thiscall miniros::Publication::getInfo(Publication *this,XmlRpcValue *info)

{
  int iVar1;
  XmlRpcValue *pXVar2;
  pointer psVar3;
  XmlRpcValue curr_info;
  string local_78;
  pthread_mutex_t *local_58;
  XmlRpcValue local_50;
  XmlRpcValue local_40;
  
  local_58 = (pthread_mutex_t *)&this->subscriber_links_mutex_;
  iVar1 = pthread_mutex_lock(local_58);
  if (iVar1 == 0) {
    psVar3 = (this->subscriber_links_).
             super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (psVar3 != (this->subscriber_links_).
                  super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_50._type = TypeInvalid;
        local_50._value.asDouble = 0.0;
        local_78._M_dataplus._M_p._0_4_ =
             ((psVar3->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->connection_id_;
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,0);
        XmlRpc::XmlRpcValue::operator=(pXVar2,(int *)&local_78);
        XmlRpc::XmlRpcValue::XmlRpcValue
                  ((XmlRpcValue *)&local_78,
                   &((psVar3->
                     super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->destination_caller_id_);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,1);
        XmlRpc::XmlRpcValue::operator=(pXVar2,(XmlRpcValue *)&local_78);
        XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_78);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,2);
        XmlRpc::XmlRpcValue::operator=(pXVar2,"o");
        (*((psVar3->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->_vptr_SubscriberLink[4])(&local_78);
        XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,&local_78);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,3);
        XmlRpc::XmlRpcValue::operator=(pXVar2,&local_40);
        XmlRpc::XmlRpcValue::invalidate(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(uint)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(uint)local_78._M_dataplus._M_p),
                          local_78.field_2._M_allocated_capacity + 1);
        }
        XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_78,&this->name_);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,4);
        XmlRpc::XmlRpcValue::operator=(pXVar2,(XmlRpcValue *)&local_78);
        XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_78);
        local_78._M_dataplus._M_p._0_4_ = CONCAT31(local_78._M_dataplus._M_p._1_3_,1);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,5);
        XmlRpc::XmlRpcValue::operator=(pXVar2,(bool *)&local_78);
        (*((psVar3->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->_vptr_SubscriberLink[5])(&local_78);
        XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,&local_78);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,6);
        XmlRpc::XmlRpcValue::operator=(pXVar2,&local_40);
        XmlRpc::XmlRpcValue::invalidate(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(uint)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(uint)local_78._M_dataplus._M_p),
                          local_78.field_2._M_allocated_capacity + 1);
        }
        iVar1 = XmlRpc::XmlRpcValue::size(info);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](info,iVar1);
        XmlRpc::XmlRpcValue::operator=(pXVar2,&local_50);
        XmlRpc::XmlRpcValue::invalidate(&local_50);
        psVar3 = psVar3 + 1;
      } while (psVar3 != (this->subscriber_links_).
                         super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pthread_mutex_unlock(local_58);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Publication::getInfo(XmlRpc::XmlRpcValue& info)
{
  std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

  for (V_SubscriberLink::iterator c = subscriber_links_.begin();
       c != subscriber_links_.end(); ++c)
  {
    XmlRpc::XmlRpcValue curr_info;
    curr_info[0] = (int)(*c)->getConnectionID();
    curr_info[1] = (*c)->getDestinationCallerID();
    curr_info[2] = "o";
    curr_info[3] = (*c)->getTransportType();
    curr_info[4] = name_;
    curr_info[5] = true; // For length compatibility with rospy
    curr_info[6] = (*c)->getTransportInfo();
    info[info.size()] = curr_info;
  }
}